

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint32_t __thiscall CLIParser::next_hex_uint(CLIParser *this)

{
  unsigned_long uVar1;
  runtime_error *this_00;
  allocator local_31;
  string local_30;
  
  if (this->argc == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Tried to parse uint, but nothing left in arguments");
  }
  else {
    std::__cxx11::string::string((string *)&local_30,*this->argv,&local_31);
    uVar1 = std::__cxx11::stoul(&local_30,(size_t *)0x0,0x10);
    std::__cxx11::string::~string((string *)&local_30);
    if (uVar1 >> 0x20 == 0) {
      this->argc = this->argc + -1;
      this->argv = this->argv + 1;
      return (uint32_t)uVar1;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"next_uint() out of range");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint32_t next_hex_uint()
	{
		if (!argc)
		{
			THROW("Tried to parse uint, but nothing left in arguments");
		}

		uint64_t val = stoul(*argv, nullptr, 16);
		if (val > numeric_limits<uint32_t>::max())
		{
			THROW("next_uint() out of range");
		}

		argc--;
		argv++;

		return uint32_t(val);
	}